

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::InstanceArrayIntersectorKMB<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  uint uVar13;
  AABBNodeMB4D *node1;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  size_t sVar17;
  size_t sVar18;
  Primitive_conflict4 *prim;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar19;
  ulong uVar20;
  NodeRef *pNVar21;
  bool bVar22;
  bool bVar23;
  int iVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar34;
  float fVar35;
  undefined1 auVar32 [16];
  float fVar36;
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar38;
  float fVar39;
  float fVar42;
  float fVar43;
  vint4 ai;
  float fVar44;
  undefined1 auVar40 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar41;
  float fVar45;
  float fVar47;
  float fVar48;
  vint4 ai_1;
  undefined1 auVar46 [16];
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  vint4 ai_3;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  vint4 bi;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  vint4 bi_3;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar78;
  float fVar79;
  vint4 bi_1;
  undefined1 auVar77 [16];
  float fVar80;
  uint uVar81;
  uint uVar82;
  uint uVar83;
  uint uVar84;
  uint uVar85;
  uint uVar86;
  vint4 ai_2;
  uint uVar87;
  uint uVar88;
  uint uVar89;
  uint uVar90;
  uint uVar91;
  uint uVar92;
  uint uVar93;
  uint uVar94;
  vint4 bi_2;
  uint uVar95;
  uint uVar96;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  vbool<4> vVar102;
  Precalculations pre;
  undefined1 local_17a8 [16];
  vbool<4> valid0;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  int local_16f8;
  int iStack_16f4;
  int iStack_16f0;
  int iStack_16ec;
  uint local_16e8;
  uint uStack_16e4;
  uint uStack_16e0;
  uint uStack_16dc;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  uVar14 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar14 != 8) {
    auVar27 = *(undefined1 (*) [16])(ray + 0x80);
    auVar57._0_12_ = ZEXT812(0);
    auVar57._12_4_ = 0;
    uVar89 = -(uint)(0.0 <= auVar27._0_4_ && (valid_i->field_0).i[0] == -1);
    uVar91 = -(uint)(0.0 <= auVar27._4_4_ && (valid_i->field_0).i[1] == -1);
    uVar93 = -(uint)(0.0 <= auVar27._8_4_ && (valid_i->field_0).i[2] == -1);
    uVar95 = -(uint)(0.0 <= auVar27._12_4_ && (valid_i->field_0).i[3] == -1);
    auVar37._4_4_ = uVar91;
    auVar37._0_4_ = uVar89;
    auVar37._8_4_ = uVar93;
    auVar37._12_4_ = uVar95;
    iVar16 = movmskps((int)context,auVar37);
    if (iVar16 != 0) {
      auVar37 = *(undefined1 (*) [16])(ray + 0x40);
      fVar64 = (float)DAT_01ff1d40;
      fVar67 = DAT_01ff1d40._4_4_;
      fVar70 = DAT_01ff1d40._8_4_;
      fVar73 = DAT_01ff1d40._12_4_;
      auVar46._4_4_ = -(uint)(ABS(auVar37._4_4_) < fVar67);
      auVar46._0_4_ = -(uint)(ABS(auVar37._0_4_) < fVar64);
      auVar46._8_4_ = -(uint)(ABS(auVar37._8_4_) < fVar70);
      auVar46._12_4_ = -(uint)(ABS(auVar37._12_4_) < fVar73);
      auVar56 = blendvps(auVar37,_DAT_01ff1d40,auVar46);
      auVar37 = *(undefined1 (*) [16])(ray + 0x60);
      auVar77._4_4_ = -(uint)(ABS(auVar37._4_4_) < fVar67);
      auVar77._0_4_ = -(uint)(ABS(auVar37._0_4_) < fVar64);
      auVar77._8_4_ = -(uint)(ABS(auVar37._8_4_) < fVar70);
      auVar77._12_4_ = -(uint)(ABS(auVar37._12_4_) < fVar73);
      auVar46 = blendvps(auVar37,_DAT_01ff1d40,auVar77);
      auVar37 = *(undefined1 (*) [16])(ray + 0x50);
      auVar77 = maxps(*(undefined1 (*) [16])(ray + 0x30),auVar57);
      auVar25._4_4_ = uVar91;
      auVar25._0_4_ = uVar89;
      auVar25._8_4_ = uVar93;
      auVar25._12_4_ = uVar95;
      aVar97.v = (__m128)blendvps(_DAT_01feb9f0,auVar77,auVar25);
      auVar77 = rcpps(auVar77,auVar56);
      fVar65 = auVar77._0_4_;
      fVar68 = auVar77._4_4_;
      fVar71 = auVar77._8_4_;
      fVar74 = auVar77._12_4_;
      iVar16 = -(uint)(ABS(auVar37._8_4_) < fVar70);
      iVar24 = -(uint)(ABS(auVar37._12_4_) < fVar73);
      auVar32._0_8_ =
           CONCAT44(-(uint)(ABS(auVar37._4_4_) < fVar67),-(uint)(ABS(auVar37._0_4_) < fVar64));
      auVar32._8_4_ = iVar16;
      auVar32._12_4_ = iVar24;
      auVar26._8_4_ = iVar16;
      auVar26._0_8_ = auVar32._0_8_;
      auVar26._12_4_ = iVar24;
      auVar77 = blendvps(auVar37,_DAT_01ff1d40,auVar26);
      auVar37 = maxps(auVar27,auVar57);
      auVar27._4_4_ = uVar91;
      auVar27._0_4_ = uVar89;
      auVar27._8_4_ = uVar93;
      auVar27._12_4_ = uVar95;
      auVar57 = blendvps(_DAT_01feba00,auVar37,auVar27);
      auVar27 = rcpps(auVar27,auVar46);
      fVar64 = auVar27._0_4_;
      fVar67 = auVar27._4_4_;
      fVar70 = auVar27._8_4_;
      fVar73 = auVar27._12_4_;
      auVar27 = rcpps(auVar32,auVar77);
      fVar98 = auVar27._0_4_;
      fVar99 = auVar27._4_4_;
      fVar100 = auVar27._8_4_;
      fVar101 = auVar27._12_4_;
      auVar27 = *(undefined1 (*) [16])ray;
      fVar98 = (1.0 - auVar77._0_4_ * fVar98) * fVar98 + fVar98;
      fVar99 = (1.0 - auVar77._4_4_ * fVar99) * fVar99 + fVar99;
      fVar100 = (1.0 - auVar77._8_4_ * fVar100) * fVar100 + fVar100;
      fVar101 = (1.0 - auVar77._12_4_ * fVar101) * fVar101 + fVar101;
      uVar11 = *(undefined8 *)(ray + 0x10);
      uVar12 = *(undefined8 *)(ray + 0x18);
      fVar65 = (1.0 - auVar56._0_4_ * fVar65) * fVar65 + fVar65;
      fVar68 = (1.0 - auVar56._4_4_ * fVar68) * fVar68 + fVar68;
      fVar71 = (1.0 - auVar56._8_4_ * fVar71) * fVar71 + fVar71;
      fVar74 = (1.0 - auVar56._12_4_ * fVar74) * fVar74 + fVar74;
      auVar37 = *(undefined1 (*) [16])(ray + 0x20);
      fVar64 = (1.0 - auVar46._0_4_ * fVar64) * fVar64 + fVar64;
      fVar67 = (1.0 - auVar46._4_4_ * fVar67) * fVar67 + fVar67;
      fVar70 = (1.0 - auVar46._8_4_ * fVar70) * fVar70 + fVar70;
      fVar73 = (1.0 - auVar46._12_4_ * fVar73) * fVar73 + fVar73;
      local_17a8._0_8_ = CONCAT44(uVar91,uVar89) ^ 0xffffffffffffffff;
      local_17a8._8_4_ = uVar93 ^ 0xffffffff;
      local_17a8._12_4_ = uVar95 ^ 0xffffffff;
      pNVar21 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar19 = &stack_near[2].field_0;
      stack_near[0].field_0 = _DAT_01feb9f0;
      stack_node[1].ptr = uVar14;
      stack_near[1].field_0 = aVar97;
LAB_0025a33c:
      paVar19 = paVar19 + -1;
      sVar18 = pNVar21[-1].ptr;
      pNVar21 = pNVar21 + -1;
      bVar23 = true;
      if (sVar18 != 0xfffffffffffffff8) {
        aVar41 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar19->v;
        fVar54 = auVar57._0_4_;
        fVar58 = auVar57._4_4_;
        fVar60 = auVar57._8_4_;
        fVar62 = auVar57._12_4_;
        auVar56._4_4_ = -(uint)(aVar41.v[1] < fVar58);
        auVar56._0_4_ = -(uint)(aVar41.v[0] < fVar54);
        auVar56._8_4_ = -(uint)(aVar41.v[2] < fVar60);
        auVar56._12_4_ = -(uint)(aVar41.v[3] < fVar62);
        uVar13 = movmskps((int)uVar14,auVar56);
        uVar14 = (ulong)uVar13;
        if (uVar13 != 0) {
          do {
            uVar13 = (uint)sVar18;
            fVar31 = aVar41.v[0];
            fVar34 = aVar41.v[1];
            fVar35 = aVar41.v[2];
            fVar36 = aVar41.v[3];
            if ((sVar18 & 8) != 0) {
              if (sVar18 == 0xfffffffffffffff8) goto LAB_0025a5b3;
              auVar29._4_4_ = -(uint)(fVar34 < fVar58);
              auVar29._0_4_ = -(uint)(fVar31 < fVar54);
              auVar29._8_4_ = -(uint)(fVar35 < fVar60);
              auVar29._12_4_ = -(uint)(fVar36 < fVar62);
              uVar81 = movmskps((int)uVar14,auVar29);
              uVar14 = (ulong)uVar81;
              if (uVar81 != 0) {
                valid0.field_0._0_8_ = local_17a8._0_8_ ^ 0xffffffffffffffff;
                valid0.field_0.i[2] = local_17a8._8_4_ ^ 0xffffffff;
                valid0.field_0.i[3] = local_17a8._12_4_ ^ 0xffffffff;
                uVar15 = (ulong)(uVar13 & 0xf) - 8;
                uVar14 = uVar15;
                if (uVar15 == 0) goto LAB_0025a656;
                prim = (Primitive_conflict4 *)(sVar18 & 0xfffffffffffffff0);
                uVar20 = 1;
                goto LAB_0025a609;
              }
              break;
            }
            uVar14 = sVar18 & 0xfffffffffffffff0;
            uVar15 = 0;
            sVar17 = 8;
            aVar38 = _DAT_01feb9f0;
            do {
              sVar2 = *(size_t *)(uVar14 + uVar15 * 8);
              sVar18 = sVar17;
              aVar41 = aVar38;
              if (sVar2 != 8) {
                fVar44 = *(float *)(uVar14 + 0x80 + uVar15 * 4);
                fVar45 = *(float *)(uVar14 + 0x20 + uVar15 * 4);
                fVar63 = *(float *)(uVar14 + 0x30 + uVar15 * 4);
                fVar49 = *(float *)(uVar14 + 0x40 + uVar15 * 4);
                fVar66 = *(float *)(uVar14 + 0x50 + uVar15 * 4);
                fVar7 = *(float *)(ray + 0x70);
                fVar8 = *(float *)(ray + 0x74);
                fVar9 = *(float *)(ray + 0x78);
                fVar10 = *(float *)(ray + 0x7c);
                fVar50 = *(float *)(uVar14 + 0xa0 + uVar15 * 4);
                fVar53 = *(float *)(uVar14 + 0xc0 + uVar15 * 4);
                fVar55 = *(float *)(uVar14 + 0x60 + uVar15 * 4);
                fVar69 = *(float *)(uVar14 + 0x90 + uVar15 * 4);
                fVar72 = *(float *)(uVar14 + 0xb0 + uVar15 * 4);
                fVar75 = *(float *)(uVar14 + 0xd0 + uVar15 * 4);
                fVar1 = *(float *)(uVar14 + 0x70 + uVar15 * 4);
                fVar39 = ((fVar44 * fVar7 + fVar45) - auVar27._0_4_) * fVar65;
                fVar42 = ((fVar44 * fVar8 + fVar45) - auVar27._4_4_) * fVar68;
                fVar43 = ((fVar44 * fVar9 + fVar45) - auVar27._8_4_) * fVar71;
                fVar44 = ((fVar44 * fVar10 + fVar45) - auVar27._12_4_) * fVar74;
                local_1738 = (float)uVar11;
                fStack_1734 = (float)((ulong)uVar11 >> 0x20);
                fStack_1730 = (float)uVar12;
                fStack_172c = (float)((ulong)uVar12 >> 0x20);
                fVar45 = ((fVar50 * fVar7 + fVar49) - local_1738) * fVar98;
                fVar47 = ((fVar50 * fVar8 + fVar49) - fStack_1734) * fVar99;
                fVar48 = ((fVar50 * fVar9 + fVar49) - fStack_1730) * fVar100;
                fVar49 = ((fVar50 * fVar10 + fVar49) - fStack_172c) * fVar101;
                local_1748 = auVar37._0_4_;
                fStack_1744 = auVar37._4_4_;
                fStack_1740 = auVar37._8_4_;
                fStack_173c = auVar37._12_4_;
                fVar50 = ((fVar53 * fVar7 + fVar55) - local_1748) * fVar64;
                fVar51 = ((fVar53 * fVar8 + fVar55) - fStack_1744) * fVar67;
                fVar52 = ((fVar53 * fVar9 + fVar55) - fStack_1740) * fVar70;
                fVar53 = ((fVar53 * fVar10 + fVar55) - fStack_173c) * fVar73;
                fVar55 = ((fVar69 * fVar7 + fVar63) - auVar27._0_4_) * fVar65;
                fVar59 = ((fVar69 * fVar8 + fVar63) - auVar27._4_4_) * fVar68;
                fVar61 = ((fVar69 * fVar9 + fVar63) - auVar27._8_4_) * fVar71;
                fVar63 = ((fVar69 * fVar10 + fVar63) - auVar27._12_4_) * fVar74;
                fVar76 = ((fVar72 * fVar7 + fVar66) - local_1738) * fVar98;
                fVar78 = ((fVar72 * fVar8 + fVar66) - fStack_1734) * fVar99;
                fVar79 = ((fVar72 * fVar9 + fVar66) - fStack_1730) * fVar100;
                fVar80 = ((fVar72 * fVar10 + fVar66) - fStack_172c) * fVar101;
                fVar66 = ((fVar75 * fVar7 + fVar1) - local_1748) * fVar64;
                fVar69 = ((fVar75 * fVar8 + fVar1) - fStack_1744) * fVar67;
                fVar72 = ((fVar75 * fVar9 + fVar1) - fStack_1740) * fVar70;
                fVar75 = ((fVar75 * fVar10 + fVar1) - fStack_173c) * fVar73;
                uVar81 = (uint)((int)fVar55 < (int)fVar39) * (int)fVar55 |
                         (uint)((int)fVar55 >= (int)fVar39) * (int)fVar39;
                uVar83 = (uint)((int)fVar59 < (int)fVar42) * (int)fVar59 |
                         (uint)((int)fVar59 >= (int)fVar42) * (int)fVar42;
                uVar85 = (uint)((int)fVar61 < (int)fVar43) * (int)fVar61 |
                         (uint)((int)fVar61 >= (int)fVar43) * (int)fVar43;
                uVar87 = (uint)((int)fVar63 < (int)fVar44) * (int)fVar63 |
                         (uint)((int)fVar63 >= (int)fVar44) * (int)fVar44;
                uVar90 = (uint)((int)fVar76 < (int)fVar45) * (int)fVar76 |
                         (uint)((int)fVar76 >= (int)fVar45) * (int)fVar45;
                uVar92 = (uint)((int)fVar78 < (int)fVar47) * (int)fVar78 |
                         (uint)((int)fVar78 >= (int)fVar47) * (int)fVar47;
                uVar94 = (uint)((int)fVar79 < (int)fVar48) * (int)fVar79 |
                         (uint)((int)fVar79 >= (int)fVar48) * (int)fVar48;
                uVar96 = (uint)((int)fVar80 < (int)fVar49) * (int)fVar80 |
                         (uint)((int)fVar80 >= (int)fVar49) * (int)fVar49;
                uVar90 = ((int)uVar90 < (int)uVar81) * uVar81 |
                         ((int)uVar90 >= (int)uVar81) * uVar90;
                uVar92 = ((int)uVar92 < (int)uVar83) * uVar83 |
                         ((int)uVar92 >= (int)uVar83) * uVar92;
                uVar94 = ((int)uVar94 < (int)uVar85) * uVar85 |
                         ((int)uVar94 >= (int)uVar85) * uVar94;
                uVar96 = ((int)uVar96 < (int)uVar87) * uVar87 |
                         ((int)uVar96 >= (int)uVar87) * uVar96;
                uVar81 = (uint)((int)fVar66 < (int)fVar50) * (int)fVar66 |
                         (uint)((int)fVar66 >= (int)fVar50) * (int)fVar50;
                uVar83 = (uint)((int)fVar69 < (int)fVar51) * (int)fVar69 |
                         (uint)((int)fVar69 >= (int)fVar51) * (int)fVar51;
                uVar85 = (uint)((int)fVar72 < (int)fVar52) * (int)fVar72 |
                         (uint)((int)fVar72 >= (int)fVar52) * (int)fVar52;
                uVar87 = (uint)((int)fVar75 < (int)fVar53) * (int)fVar75 |
                         (uint)((int)fVar75 >= (int)fVar53) * (int)fVar53;
                uVar82 = ((int)uVar81 < (int)uVar90) * uVar90 |
                         ((int)uVar81 >= (int)uVar90) * uVar81;
                uVar84 = ((int)uVar83 < (int)uVar92) * uVar92 |
                         ((int)uVar83 >= (int)uVar92) * uVar83;
                uVar86 = ((int)uVar85 < (int)uVar94) * uVar94 |
                         ((int)uVar85 >= (int)uVar94) * uVar85;
                uVar88 = ((int)uVar87 < (int)uVar96) * uVar96 |
                         ((int)uVar87 >= (int)uVar96) * uVar87;
                uVar81 = (uint)((int)fVar55 < (int)fVar39) * (int)fVar39 |
                         (uint)((int)fVar55 >= (int)fVar39) * (int)fVar55;
                uVar83 = (uint)((int)fVar59 < (int)fVar42) * (int)fVar42 |
                         (uint)((int)fVar59 >= (int)fVar42) * (int)fVar59;
                uVar85 = (uint)((int)fVar61 < (int)fVar43) * (int)fVar43 |
                         (uint)((int)fVar61 >= (int)fVar43) * (int)fVar61;
                uVar87 = (uint)((int)fVar63 < (int)fVar44) * (int)fVar44 |
                         (uint)((int)fVar63 >= (int)fVar44) * (int)fVar63;
                uVar90 = (uint)((int)fVar76 < (int)fVar45) * (int)fVar45 |
                         (uint)((int)fVar76 >= (int)fVar45) * (int)fVar76;
                uVar92 = (uint)((int)fVar78 < (int)fVar47) * (int)fVar47 |
                         (uint)((int)fVar78 >= (int)fVar47) * (int)fVar78;
                uVar94 = (uint)((int)fVar79 < (int)fVar48) * (int)fVar48 |
                         (uint)((int)fVar79 >= (int)fVar48) * (int)fVar79;
                uVar96 = (uint)((int)fVar80 < (int)fVar49) * (int)fVar49 |
                         (uint)((int)fVar80 >= (int)fVar49) * (int)fVar80;
                uVar90 = ((int)uVar81 < (int)uVar90) * uVar81 |
                         ((int)uVar81 >= (int)uVar90) * uVar90;
                uVar92 = ((int)uVar83 < (int)uVar92) * uVar83 |
                         ((int)uVar83 >= (int)uVar92) * uVar92;
                uVar94 = ((int)uVar85 < (int)uVar94) * uVar85 |
                         ((int)uVar85 >= (int)uVar94) * uVar94;
                uVar96 = ((int)uVar87 < (int)uVar96) * uVar87 |
                         ((int)uVar87 >= (int)uVar96) * uVar96;
                uVar81 = (uint)((int)fVar66 < (int)fVar50) * (int)fVar50 |
                         (uint)((int)fVar66 >= (int)fVar50) * (int)fVar66;
                uVar83 = (uint)((int)fVar69 < (int)fVar51) * (int)fVar51 |
                         (uint)((int)fVar69 >= (int)fVar51) * (int)fVar69;
                uVar85 = (uint)((int)fVar72 < (int)fVar52) * (int)fVar52 |
                         (uint)((int)fVar72 >= (int)fVar52) * (int)fVar72;
                uVar87 = (uint)((int)fVar75 < (int)fVar53) * (int)fVar53 |
                         (uint)((int)fVar75 >= (int)fVar53) * (int)fVar75;
                uVar81 = (uint)((int)fVar54 < (int)uVar81) * (int)fVar54 |
                         ((int)fVar54 >= (int)uVar81) * uVar81;
                uVar83 = (uint)((int)fVar58 < (int)uVar83) * (int)fVar58 |
                         ((int)fVar58 >= (int)uVar83) * uVar83;
                uVar85 = (uint)((int)fVar60 < (int)uVar85) * (int)fVar60 |
                         ((int)fVar60 >= (int)uVar85) * uVar85;
                uVar87 = (uint)((int)fVar62 < (int)uVar87) * (int)fVar62 |
                         ((int)fVar62 >= (int)uVar87) * uVar87;
                local_16f8 = aVar97.i[0];
                iStack_16f4 = aVar97.i[1];
                iStack_16f0 = aVar97.i[2];
                iStack_16ec = aVar97.i[3];
                bVar22 = (float)((uint)((int)uVar82 < local_16f8) * local_16f8 |
                                ((int)uVar82 >= local_16f8) * uVar82) <=
                         (float)(((int)uVar90 < (int)uVar81) * uVar90 |
                                ((int)uVar90 >= (int)uVar81) * uVar81);
                bVar3 = (float)((uint)((int)uVar84 < iStack_16f4) * iStack_16f4 |
                               ((int)uVar84 >= iStack_16f4) * uVar84) <=
                        (float)(((int)uVar92 < (int)uVar83) * uVar92 |
                               ((int)uVar92 >= (int)uVar83) * uVar83);
                bVar4 = (float)((uint)((int)uVar86 < iStack_16f0) * iStack_16f0 |
                               ((int)uVar86 >= iStack_16f0) * uVar86) <=
                        (float)(((int)uVar94 < (int)uVar85) * uVar94 |
                               ((int)uVar94 >= (int)uVar85) * uVar85);
                bVar5 = (float)((uint)((int)uVar88 < iStack_16ec) * iStack_16ec |
                               ((int)uVar88 >= iStack_16ec) * uVar88) <=
                        (float)(((int)uVar96 < (int)uVar87) * uVar96 |
                               ((int)uVar96 >= (int)uVar87) * uVar87);
                auVar40._4_4_ = -(uint)bVar3;
                auVar40._0_4_ = -(uint)bVar22;
                auVar40._8_4_ = -(uint)bVar4;
                auVar40._12_4_ = -(uint)bVar5;
                if ((uVar13 & 7) == 6) {
                  fVar44 = *(float *)(uVar14 + 0xe0 + uVar15 * 4);
                  fVar45 = *(float *)(uVar14 + 0xf0 + uVar15 * 4);
                  auVar40._0_4_ = -(uint)((fVar7 < fVar45 && fVar44 <= fVar7) && bVar22);
                  auVar40._4_4_ = -(uint)((fVar8 < fVar45 && fVar44 <= fVar8) && bVar3);
                  auVar40._8_4_ = -(uint)((fVar9 < fVar45 && fVar44 <= fVar9) && bVar4);
                  auVar40._12_4_ = -(uint)((fVar10 < fVar45 && fVar44 <= fVar10) && bVar5);
                }
                auVar28._0_4_ = (-(uint)(fVar31 < fVar54) & auVar40._0_4_) << 0x1f;
                auVar28._4_4_ = (-(uint)(fVar34 < fVar58) & auVar40._4_4_) << 0x1f;
                auVar28._8_4_ = (-(uint)(fVar35 < fVar60) & auVar40._8_4_) << 0x1f;
                auVar28._12_4_ = (-(uint)(fVar36 < fVar62) & auVar40._12_4_) << 0x1f;
                uVar81 = movmskps((int)valid_i,auVar28);
                valid_i = (vint<4> *)(ulong)uVar81;
                if ((uVar81 != 0) &&
                   (auVar6._4_4_ = uVar84, auVar6._0_4_ = uVar82, auVar6._8_4_ = uVar86,
                   auVar6._12_4_ = uVar88, aVar41.v = (__m128)blendvps(_DAT_01feb9f0,auVar6,auVar28)
                   , sVar18 = sVar2, sVar17 != 8)) {
                  pNVar21->ptr = sVar17;
                  pNVar21 = pNVar21 + 1;
                  *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar19->v = aVar38;
                  paVar19 = paVar19 + 1;
                }
              }
            } while ((sVar2 != 8) &&
                    (bVar22 = uVar15 < 3, uVar15 = uVar15 + 1, sVar17 = sVar18, aVar38 = aVar41,
                    bVar22));
          } while (sVar18 != 8);
        }
        bVar23 = false;
      }
      goto LAB_0025a5b3;
    }
  }
  return;
  while( true ) {
    prim = prim + 1;
    uVar14 = uVar20 + 1;
    bVar23 = uVar15 <= uVar20;
    uVar20 = uVar14;
    if (bVar23) break;
LAB_0025a609:
    valid_i = (vint<4> *)&local_16e8;
    vVar102 = InstanceArrayIntersectorKMB<4>::occluded
                        ((InstanceArrayIntersectorKMB<4> *)valid_i,&valid0,&pre,ray,context,prim);
    valid0.field_0.i[0] = ~local_16e8 & valid0.field_0.i[0];
    valid0.field_0.i[1] = ~uStack_16e4 & valid0.field_0.i[1];
    valid0.field_0.i[2] = ~uStack_16e0 & valid0.field_0.i[2];
    valid0.field_0.i[3] = ~uStack_16dc & valid0.field_0.i[3];
    uVar13 = movmskps(vVar102.field_0._0_4_,(undefined1  [16])valid0.field_0);
    uVar14 = (ulong)uVar13;
    if (uVar13 == 0) break;
  }
LAB_0025a656:
  auVar33._8_4_ = 0xffffffff;
  auVar33._0_8_ = 0xffffffffffffffff;
  auVar33._12_4_ = 0xffffffff;
  local_17a8 = local_17a8 | (undefined1  [16])valid0.field_0 ^ auVar33;
  uVar13 = movmskps((int)uVar14,local_17a8);
  uVar14 = (ulong)uVar13;
  if (uVar13 == 0xf) {
    bVar23 = true;
  }
  else {
    auVar57 = blendvps(auVar57,_DAT_01feba00,local_17a8);
    bVar23 = false;
  }
LAB_0025a5b3:
  if (bVar23) {
    auVar30._0_4_ = uVar89 & local_17a8._0_4_;
    auVar30._4_4_ = uVar91 & local_17a8._4_4_;
    auVar30._8_4_ = uVar93 & local_17a8._8_4_;
    auVar30._12_4_ = uVar95 & local_17a8._12_4_;
    auVar27 = blendvps(*(undefined1 (*) [16])(ray + 0x80),_DAT_01feba00,auVar30);
    *(undefined1 (*) [16])(ray + 0x80) = auVar27;
    return;
  }
  goto LAB_0025a33c;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }